

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O1

QString * __thiscall
ProjectBuilderMakefileGenerator::fixForOutput
          (QString *__return_storage_ptr__,ProjectBuilderMakefileGenerator *this,QString *values)

{
  QMakeProject *pQVar1;
  Data *pDVar2;
  int *piVar3;
  QArrayData *pQVar4;
  char cVar5;
  int iVar6;
  QList<ProString> *pQVar7;
  qsizetype qVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QRegularExpressionMatch match;
  QRegularExpression reg_var;
  QString local_c0;
  ProString local_a8;
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  qsizetype local_68;
  QArrayData *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QVar9.m_data = (storage_type *)0xa;
  QVar9.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar9);
  local_a8.m_string.d.d._0_4_ = (undefined4)local_78;
  local_a8.m_string.d.d._4_4_ = local_78._4_4_;
  local_a8.m_string.d.ptr._0_4_ = uStack_70;
  local_a8.m_string.d.ptr._4_4_ = uStack_6c;
  local_a8.m_string.d.size = local_68;
  QRegularExpression::QRegularExpression((QRegularExpression *)&local_40,&local_a8,0);
  piVar3 = (int *)CONCAT44(local_a8.m_string.d.d._4_4_,local_a8.m_string.d.d._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_a8.m_string.d.d._4_4_,local_a8.m_string.d.d._0_4_),2,
                 0x10);
    }
  }
  local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  QRegularExpressionMatch::QRegularExpressionMatch((QRegularExpressionMatch *)&local_48);
  iVar6 = 0;
  while( true ) {
    QRegularExpression::match((QRegularExpressionMatch *)&local_78,&local_40,values,(long)iVar6,0,0)
    ;
    pQVar4 = local_48;
    local_48 = local_78;
    local_78 = pQVar4;
    cVar5 = QRegularExpressionMatch::hasMatch();
    QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_78);
    if (cVar5 == '\0') break;
    pQVar1 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&local_78,"QMAKE_PBX_VARS");
    pQVar7 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_78)->
              super_QList<ProString>;
    QRegularExpressionMatch::captured((int)&local_a8);
    qVar8 = QtPrivate::indexOf<ProString,QString>(pQVar7,&local_a8.m_string,0);
    piVar3 = (int *)CONCAT44(local_a8.m_string.d.d._4_4_,local_a8.m_string.d.d._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_a8.m_string.d.d._4_4_,local_a8.m_string.d.d._0_4_),2
                   ,0x10);
      }
    }
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (qVar8 == -1) {
      pQVar1 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&local_78,"QMAKE_PBX_VARS");
      pQVar7 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_78)->
                super_QList<ProString>;
      QRegularExpressionMatch::captured((int)&local_c0);
      ProString::ProString(&local_a8,&local_c0);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar7,(pQVar7->d).size,&local_a8);
      QList<ProString>::end(pQVar7);
      piVar3 = (int *)CONCAT44(local_a8.m_string.d.d._4_4_,local_a8.m_string.d.d._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_a8.m_string.d.d._4_4_,local_a8.m_string.d.d._0_4_)
                     ,2,0x10);
        }
      }
      if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_78 != (QArrayData *)0x0) {
        LOCK();
        (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_78,2,0x10);
        }
      }
    }
    iVar6 = QRegularExpressionMatch::capturedEnd((int)(QRegularExpressionMatch *)&local_48);
  }
  pDVar2 = (values->d).d;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = (values->d).ptr;
  (__return_storage_ptr__->d).size = (values->d).size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_48);
  QRegularExpression::~QRegularExpression((QRegularExpression *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
ProjectBuilderMakefileGenerator::fixForOutput(const QString &values)
{
    //get the environment variables references
    QRegularExpression reg_var("\\$\\((.*)\\)");
    QRegularExpressionMatch match;
    for (int rep = 0; (match = reg_var.match(values, rep)).hasMatch();) {
        if (project->values("QMAKE_PBX_VARS").indexOf(match.captured(1)) == -1)
            project->values("QMAKE_PBX_VARS").append(match.captured(1));
        rep = match.capturedEnd();
    }

    return values;
}